

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::TestUtil::ReflectionTester::F(ReflectionTester *this,string *name)

{
  ushort uVar1;
  Descriptor *this_00;
  ushort *puVar2;
  FileDescriptor *this_01;
  int iVar3;
  FieldDescriptor *pFVar4;
  undefined8 extraout_RAX;
  size_type __rlen;
  char *__s2;
  string_view name_00;
  string_view name_01;
  string local_90;
  undefined1 local_70 [56];
  EnumValueDescriptor *local_38;
  
  this_00 = this->base_descriptor_;
  puVar2 = (ushort *)(this_00->all_names_).payload_;
  uVar1 = *puVar2;
  if (uVar1 == 0x14) {
    __s2 = "TestPackedExtensions";
LAB_00654322:
    iVar3 = bcmp((void *)((long)puVar2 + ~(ulong)uVar1),__s2,(ulong)uVar1);
    if (iVar3 == 0) {
      this_01 = this_00->file_;
      local_70._8_8_ = (name->_M_dataplus)._M_p;
      local_70._0_8_ = name->_M_string_length;
      local_70._48_8_ = &DAT_0000000a;
      local_38 = (EnumValueDescriptor *)0x10f76f1;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_90,(lts_20250127 *)local_70,(AlphaNum *)(local_70 + 0x30),
                 (AlphaNum *)local_70._0_8_);
      name_01._M_str = local_90._M_dataplus._M_p;
      name_01._M_len = local_90._M_string_length;
      pFVar4 = FileDescriptor::FindExtensionByName(this_01,name_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0065433d;
    }
  }
  else if (uVar1 == 0x11) {
    __s2 = "TestAllExtensions";
    goto LAB_00654322;
  }
  name_00._M_str = (name->_M_dataplus)._M_p;
  name_00._M_len = name->_M_string_length;
  pFVar4 = Descriptor::FindFieldByName(this_00,name_00);
LAB_0065433d:
  if (pFVar4 != (FieldDescriptor *)0x0) {
    return pFVar4;
  }
  F((ReflectionTester *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

inline const FieldDescriptor* TestUtil::ReflectionTester::F(
    const std::string& name) {
  const FieldDescriptor* result = nullptr;
  if (base_descriptor_->name() == "TestAllExtensions" ||
      base_descriptor_->name() == "TestPackedExtensions") {
    result = base_descriptor_->file()->FindExtensionByName(
        absl::StrCat(name, "_extension"));
  } else {
    result = base_descriptor_->FindFieldByName(name);
  }
  ABSL_CHECK(result != nullptr);
  return result;
}